

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O3

void __thiscall
xLearn::DMatrix::Compress
          (DMatrix *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *feature_list)

{
  pointer ppvVar1;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *pvVar2;
  pointer pNVar3;
  undefined1 auVar4 [16];
  pointer ppvVar5;
  const_iterator cVar6;
  pointer puVar7;
  pointer puVar8;
  mapped_type *pmVar9;
  long lVar10;
  uint uVar11;
  pointer pNVar12;
  ulong uVar13;
  size_type __bkt_count;
  size_type __bkt_count_00;
  pointer puVar14;
  index_t *__k;
  undefined1 in_ZMM0 [64];
  undefined1 in_XMM1 [16];
  feature_map mp;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  feat_set;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  ppvVar5 = (this->row).
            super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppvVar1 = (this->row).
            super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppvVar5 == ppvVar1) {
    __bkt_count = 0;
  }
  else {
    lVar10 = 0;
    do {
      pvVar2 = *ppvVar5;
      ppvVar5 = ppvVar5 + 1;
      lVar10 = lVar10 + ((long)(pvVar2->
                               super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar2->
                               super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    } while (ppvVar5 != ppvVar1);
    auVar4 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,lVar10);
    __bkt_count = vcvttsd2usi_avx512f(auVar4);
  }
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::rehash(&local_68,__bkt_count);
  uVar11 = this->row_length;
  if (uVar11 != 0) {
    uVar13 = 0;
    do {
      pvVar2 = (this->row).
               super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar13];
      pNVar12 = (pvVar2->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (pNVar12 !=
          *(pointer *)
           ((long)&(pvVar2->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl
                   .super__Vector_impl_data + 8)) {
        do {
          cVar6 = std::
                  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::find(&local_68,&pNVar12->feat_id);
          if (cVar6.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
            local_a0._M_buckets = (__buckets_ptr)&local_68;
            std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&local_68,&pNVar12->feat_id,&local_a0);
          }
          pNVar12 = pNVar12 + 1;
        } while (pNVar12 !=
                 *(pointer *)
                  ((long)&(pvVar2->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>).
                          _M_impl.super__Vector_impl_data + 8));
        uVar11 = this->row_length;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < uVar11);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (feature_list,local_68._M_element_count);
  std::__copy_move<false,false,std::forward_iterator_tag>::
  __copy_m<std::__detail::_Node_iterator<unsigned_int,true,false>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((_Node_iterator<unsigned_int,_true,_false>)local_68._M_before_begin._M_nxt,
             (_Node_iterator<unsigned_int,_true,_false>)0x0,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             feature_list);
  puVar7 = (feature_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar8 = (feature_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar14 = puVar7;
  if (puVar7 != puVar8) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar7,puVar8,(int)LZCOUNT((long)puVar8 - (long)puVar7 >> 2) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar7,puVar8);
    puVar7 = (feature_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    puVar14 = (feature_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
              _M_impl.super__Vector_impl_data._M_start;
  }
  local_a0._M_buckets = &local_a0._M_single_bucket;
  local_a0._M_bucket_count = 1;
  local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a0._M_element_count = 0;
  local_a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_a0._M_rehash_policy._M_next_resize = 0;
  local_a0._M_single_bucket = (__node_base_ptr)0x0;
  auVar4 = vcvtusi2sd_avx512f(in_XMM1,(long)puVar7 - (long)puVar14 >> 2);
  __bkt_count_00 = vcvttsd2usi_avx512f(auVar4);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash(&local_a0,__bkt_count_00);
  puVar8 = (feature_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((feature_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar8) {
    uVar11 = 1;
    uVar13 = 0;
    do {
      pmVar9 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_a0,puVar8 + uVar13);
      *pmVar9 = uVar11;
      uVar13 = (ulong)uVar11;
      uVar11 = uVar11 + 1;
      puVar8 = (feature_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(feature_list->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 2))
    ;
  }
  uVar11 = this->row_length;
  if (uVar11 != 0) {
    uVar13 = 0;
    do {
      pvVar2 = (this->row).
               super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar13];
      pNVar12 = (pvVar2->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pNVar3 = *(pointer *)
                ((long)&(pvVar2->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>).
                        _M_impl.super__Vector_impl_data + 8);
      if (pNVar12 != pNVar3) {
        __k = &pNVar12->feat_id;
        do {
          pmVar9 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_a0,__k);
          *__k = *pmVar9;
          pNVar12 = (pointer)(__k + 2);
          __k = __k + 3;
        } while (pNVar12 != pNVar3);
        uVar11 = this->row_length;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < uVar11);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_a0);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void Compress(std::vector<index_t>& feature_list) {
    // Using a map to store the mapping relations
    size_t node_num {0};
    for (auto row : this->row) {
      node_num += row->size();
    }
    std::unordered_set<index_t> feat_set;
    feat_set.reserve(node_num);
    for (index_t i = 0; i < this->row_length; ++i) {
      SparseRow* row = this->row[i];
      for (SparseRow::iterator iter = row->begin();
           iter != row->end(); ++iter) {
        if (feat_set.count(iter->feat_id) == 0) {
          feat_set.insert(iter->feat_id);
        }
      }
    }
    feature_list.reserve(feat_set.size());
    std::copy(feat_set.begin(), feat_set.end(), 
              std::back_inserter(feature_list));
    std::sort(begin(feature_list), end(feature_list));
    feature_map mp;
    mp.reserve(feature_list.size());
    for (index_t i = 0; i < feature_list.size(); ++ i) {
      mp[feature_list[i]] = i + 1;
    }
    for (index_t i = 0; i < this->row_length; ++ i) {
      for (auto &iter: *this->row[i]) {
        // using map is better than lower_bound
        iter.feat_id = mp[iter.feat_id];
      }
    }
  }